

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  DHANDLE dhandle_00;
  DHANDLE dhandle;
  char *application_name;
  char *host;
  unsigned_short port;
  char **argv_local;
  int argc_local;
  
  dhandle_00 = dino_config_start_http
                         ("test_framework","localhost",true,"main",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                          ,0x122);
  _Var1 = dino_http_port(dhandle_00,0x2378,"main",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                         ,0x122);
  if ((((((_Var1) &&
         (_Var1 = dino_route_get(dhandle_00,get_amor,"amor","/","main",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                 ,0x123), _Var1)) &&
        (_Var1 = dino_route_get(dhandle_00,get_template_test,"template_test","/template","main",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                ,0x124), _Var1)) &&
       ((_Var1 = dino_route_get(dhandle_00,get_sway,"sway","/:wine/:bottle","main",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                ,0x125), _Var1 &&
        (_Var1 = dino_route_post(dhandle_00,post_main,"main","/","main",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                 ,0x126), _Var1)))) &&
      ((_Var1 = dino_route_delete(dhandle_00,delete_main,"main","/","main",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                  ,0x127), _Var1 &&
       ((_Var1 = dino_route_put(dhandle_00,put_main,"main","/","main",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                ,0x128), _Var1 &&
        (_Var1 = dino_route_options(dhandle_00,options_main,"main","/","main",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                    ,0x129), _Var1)))))) &&
     ((_Var1 = dino_route_head(dhandle_00,head_main,"main","/","main",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                               ,0x12a), _Var1 &&
      (_Var1 = dino_route_trace(dhandle_00,trace_main,"main","/","main",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                                ,299), _Var1)))) {
    dino_route_connect(dhandle_00,connect_volare,"volare","/","main",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
                       ,300);
  }
  dino_start(dhandle_00,"main",
             "/workspace/llm4binary/github/license_all_cmakelists_25/henryse[P]dino-web-framework/test/main.c"
             ,0x12f);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    unsigned short port = 9080;
    char *host = "localhost";
    const char *application_name = "test_framework";

    DINO_CONFIG_START_HTTP(application_name, host, port, true);
        ROUTE_GET(amor, "/")
        ROUTE_GET(template_test, "/template");
        ROUTE_GET(sway, "/:wine/:bottle")
        ROUTE_POST(main, "/")
        ROUTE_DELETE(main, "/")
        ROUTE_PUT(main, "/")
        ROUTE_OPTIONS(main, "/")
        ROUTE_HEAD(main, "/")
        ROUTE_TRACE(main, "/")
        ROUTE_CONNECT(volare, "/")
    DINO_CONFIG_END;

    DINO_START;

    return 0;
}